

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  connectdata *pcVar2;
  connectdata *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  unsigned_short uVar8;
  CURLcode CVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  _Bool eos;
  size_t nread;
  _Bool local_39;
  size_t local_38;
  
  pcVar2 = data->conn;
  *msg = (void *)0x0;
  if (((pcVar2->proto).ftpc.pp.sendbuf.allc == 0) &&
     (uVar5 = (pcVar2->proto).ftpc.pp.sendbuf.leng, uVar5 != 0)) {
    local_38 = 0x9000;
    if (uVar5 < 0x9000) {
      local_38 = uVar5;
    }
    CVar9 = Curl_client_read(data,(pcVar2->proto).smbc.send_buf,local_38,&local_38,&local_39);
    if ((CVar9 == CURLE_AGAIN) || (CVar9 == CURLE_OK)) {
      if (local_38 == 0) {
        bVar7 = false;
        CVar9 = CURLE_OK;
      }
      else {
        psVar1 = &(pcVar2->proto).ftpc.pp.sendbuf.leng;
        *psVar1 = *psVar1 - local_38;
        (pcVar2->proto).ftpc.pp.sendbuf.allc = local_38;
        (pcVar2->proto).ftpc.pp.sendbuf.toobig = 0;
        bVar7 = true;
        CVar9 = CURLE_OK;
      }
    }
    else {
      bVar7 = false;
    }
    if (!bVar7) {
      return CVar9;
    }
  }
  if ((pcVar2->proto).ftpc.pp.sendbuf.allc == 0) goto LAB_00158cdd;
  pcVar3 = data->conn;
  sVar13 = (pcVar3->proto).ftpc.pp.sendbuf.allc;
  if (sVar13 == 0) {
LAB_00158cd3:
    CVar9 = CURLE_OK;
  }
  else {
    sVar4 = (pcVar3->proto).ftpc.pp.sendbuf.toobig;
    sVar13 = sVar13 - sVar4;
    CVar9 = Curl_xfer_send(data,(pcVar3->proto).smbc.send_buf + sVar4,sVar13,false,&local_38);
    if (CVar9 == CURLE_OK) {
      if (local_38 == sVar13) {
        (pcVar3->proto).ftpc.pp.sendbuf.allc = 0;
      }
      else {
        psVar1 = &(pcVar3->proto).ftpc.pp.sendbuf.toobig;
        *psVar1 = *psVar1 + local_38;
      }
      goto LAB_00158cd3;
    }
  }
  if (CVar9 != CURLE_OK) {
    return CVar9;
  }
LAB_00158cdd:
  CVar9 = CURLE_AGAIN;
  if (((pcVar2->proto).ftpc.pp.sendbuf.allc == 0) && ((pcVar2->proto).ftpc.pp.sendbuf.leng == 0)) {
    pcVar2 = data->conn;
    pcVar6 = (pcVar2->proto).smbc.recv_buf;
    pcVar10 = (pcVar2->proto).ftpc.pp.recvbuf.bufr;
    CVar9 = Curl_xfer_recv(data,pcVar6 + (long)pcVar10,0x9000 - (long)pcVar10,(ssize_t *)&local_38);
    if ((CVar9 == CURLE_OK) &&
       ((CVar9 = CURLE_OK, local_38 != 0 &&
        (pcVar10 = (pcVar2->proto).ftpc.pp.recvbuf.bufr + local_38,
        (pcVar2->proto).ftpc.pp.recvbuf.bufr = pcVar10, (char *)0x3 < pcVar10)))) {
      uVar8 = Curl_read16_be((uchar *)(pcVar6 + 2));
      if ((char *)((ulong)uVar8 + 4) <= (pcVar2->proto).ftpc.pp.recvbuf.bufr) {
        if (0x20 < uVar8) {
          uVar11 = (uint)(byte)pcVar6[0x24] * 2 + 0x27;
          uVar12 = (uint)(char *)((ulong)uVar8 + 4);
          if ((uVar11 <= uVar12) &&
             (uVar8 = Curl_read16_le((uchar *)(pcVar6 + (ulong)((uint)(byte)pcVar6[0x24] * 2) + 0x25
                                              )), uVar12 < uVar11 + uVar8)) {
            return CURLE_READ_ERROR;
          }
        }
        *msg = pcVar6;
        CVar9 = CURLE_OK;
      }
    }
  }
  return CVar9;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)MAX_MESSAGE_SIZE ?
      (size_t)MAX_MESSAGE_SIZE : smbc->upload_size;
    bool eos;

    result = Curl_client_read(data, smbc->send_buf, nread, &nread, &eos);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}